

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_19cd26::SQLiteBuildDB::lookupRuleResult
          (SQLiteBuildDB *this,KeyID keyID,KeyType *key,Result *result_out,string *error_out)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  Epoch EVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  char *pcVar8;
  uint64_t uVar9;
  KeyID KVar10;
  int __oflag;
  sqlite3_stmt **ppsVar11;
  int i;
  ulong uVar12;
  bool bVar13;
  Timestamp TVar14;
  iterator iVar15;
  DBKeyID local_a8;
  KeyID keyID_local;
  BinaryDecoder decoder;
  Child local_78 [2];
  undefined2 local_68;
  Twine local_60;
  Twine local_48;
  
  keyID_local = keyID;
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x1c3,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                 );
  }
  std::mutex::lock(&this->dbMutex);
  if (result_out->builtAt != 0) {
    __assert_fail("result_out->builtAt == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x1c5,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                 );
  }
  iVar2 = open(this,(char *)error_out,__oflag);
  if ((char)iVar2 == '\0') {
    bVar13 = false;
    goto LAB_0013d9c4;
  }
  iVar15 = llvm::
           DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
           ::find((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                   *)&this->dbKeyIDs,&keyID_local);
  if (iVar15.Ptr == (this->dbKeyIDs).Buckets + (this->dbKeyIDs).NumBuckets) {
    iVar2 = sqlite3_reset(this->findRuleResultStmt);
    if (iVar2 != 0) goto LAB_0013d99b;
    ppsVar11 = &this->findRuleResultStmt;
    iVar2 = sqlite3_clear_bindings(*ppsVar11);
    if ((iVar2 != 0) ||
       (iVar2 = sqlite3_bind_text(*ppsVar11,1,(key->key)._M_dataplus._M_p,
                                  (int)(key->key)._M_string_length,0), iVar2 != 0))
    goto LAB_0013d99b;
    iVar2 = sqlite3_step(*ppsVar11);
    if (iVar2 == 100) {
      iVar2 = sqlite3_column_count(*ppsVar11);
      if (iVar2 != 8) {
        __assert_fail("sqlite3_column_count(findRuleResultStmt) == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                      ,0x211,
                      "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                     );
      }
      local_a8.value = sqlite3_column_int64(this->findRuleResultStmt,0);
      iVar2 = sqlite3_column_bytes(this->findRuleResultStmt,1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&result_out->value,(long)iVar2);
      puVar1 = (result_out->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (void *)sqlite3_column_blob(this->findRuleResultStmt,1);
      memcpy(puVar1,pvVar4,(long)iVar2);
      EVar5 = sqlite3_column_int64(this->findRuleResultStmt,2);
      result_out->builtAt = EVar5;
      EVar5 = sqlite3_column_int64(this->findRuleResultStmt,3);
      result_out->computedAt = EVar5;
      TVar14 = (Timestamp)sqlite3_column_double(this->findRuleResultStmt,4);
      result_out->start = TVar14;
      TVar14 = (Timestamp)sqlite3_column_double(this->findRuleResultStmt,5);
      result_out->end = TVar14;
      pvVar6 = llvm::
               DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
               ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                   *)&this->engineKeyIDs,&local_a8);
      (pvVar6->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = keyID_local._value;
      pvVar7 = llvm::
               DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
               ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                   *)&this->dbKeyIDs,&keyID_local);
      (pvVar7->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = local_a8.value;
      goto LAB_0013dabd;
    }
LAB_0013d996:
    if (iVar2 != 0x65) goto LAB_0013d99b;
  }
  else {
    iVar2 = sqlite3_reset(this->fastFindRuleResultStmt);
    if (iVar2 == 0) {
      ppsVar11 = &this->fastFindRuleResultStmt;
      iVar2 = sqlite3_clear_bindings(*ppsVar11);
      if ((iVar2 != 0) ||
         (iVar2 = sqlite3_bind_int64(*ppsVar11,1,
                                     ((iVar15.Ptr)->super_pair<llbuild::core::KeyID,_DBKeyID>).
                                     second.value), iVar2 != 0)) goto LAB_0013d99b;
      iVar2 = sqlite3_step(*ppsVar11);
      if (iVar2 != 100) goto LAB_0013d996;
      iVar2 = sqlite3_column_count(*ppsVar11);
      if (iVar2 != 8) {
        __assert_fail("sqlite3_column_count(fastFindRuleResultStmt) == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                      ,0x1e8,
                      "virtual bool (anonymous namespace)::SQLiteBuildDB::lookupRuleResult(KeyID, const KeyType &, Result *, std::string *)"
                     );
      }
      local_a8.value = sqlite3_column_int64(*ppsVar11,0);
      iVar2 = sqlite3_column_bytes(*ppsVar11,1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&result_out->value,(long)iVar2);
      puVar1 = (result_out->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (void *)sqlite3_column_blob(*ppsVar11,1);
      memcpy(puVar1,pvVar4,(long)iVar2);
      EVar5 = sqlite3_column_int64(*ppsVar11,2);
      result_out->builtAt = EVar5;
      EVar5 = sqlite3_column_int64(*ppsVar11,3);
      result_out->computedAt = EVar5;
      TVar14 = (Timestamp)sqlite3_column_double(*ppsVar11,4);
      result_out->start = TVar14;
      TVar14 = (Timestamp)sqlite3_column_double(*ppsVar11,5);
      result_out->end = TVar14;
LAB_0013dabd:
      uVar3 = sqlite3_column_bytes(*ppsVar11,6);
      pcVar8 = (char *)sqlite3_column_blob(*ppsVar11,6);
      uVar9 = sqlite3_column_int64(*ppsVar11,7);
      (result_out->signature).value = uVar9;
      if ((uVar3 & 7) == 0) {
        llbuild::core::DependencyKeyIDs::resize(&result_out->dependencies,(long)((int)uVar3 >> 3));
        decoder.pos = 0;
        decoder.data.Data = pcVar8;
        decoder.data.Length = (long)(int)uVar3;
        for (uVar12 = 0; bVar13 = (uint)((int)uVar3 >> 3) == uVar12, !bVar13; uVar12 = uVar12 + 1) {
          uVar9 = llbuild::basic::BinaryDecoder::read64(&decoder);
          KVar10 = getKeyIDForID(this,(DBKeyID)(uVar9 >> 2),error_out);
          if (error_out->_M_string_length != 0) break;
          (result_out->dependencies).keys.
          super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12]._value = KVar10._value;
          (result_out->dependencies).flags.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] = (byte)uVar9 & 3;
        }
        goto LAB_0013d9c4;
      }
      llvm::Twine::Twine(&local_60,"unexpected contents for database result: ");
      local_68 = 0x10a;
      local_78[0].decUI = (uint)local_a8.value;
      llvm::Twine::concat(&local_48,&local_60,(Twine *)local_78);
      llvm::Twine::str_abi_cxx11_((string *)&decoder,&local_48);
    }
    else {
LAB_0013d99b:
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                ((string *)&decoder,this);
    }
    std::__cxx11::string::operator=((string *)error_out,(string *)&decoder);
    std::__cxx11::string::_M_dispose();
  }
  bVar13 = false;
LAB_0013d9c4:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar13;
}

Assistant:

virtual bool lookupRuleResult(KeyID keyID, const KeyType& key,
                                Result* result_out,
                                std::string *error_out) override {
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    assert(result_out->builtAt == 0);

    if (!open(error_out)) {
      return false;
    }

    // Fetch the basic rule information.
    int result;
    int numDependencyBytes = 0;
    const void* dependencyBytes = nullptr;
    DBKeyID dbKeyID;

    // Check if we already have the key mapping
    auto it = dbKeyIDs.find(keyID);
    if (it != dbKeyIDs.end()) {
      // DBKeyID is known, perform the fast path that avoids table joining

      result = sqlite3_reset(fastFindRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_clear_bindings(fastFindRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_bind_int64(fastFindRuleResultStmt, /*index=*/1,
                                  it->second.value);
      checkSQLiteResultOKReturnFalse(result);

      // If the rule wasn't found, we are done.
      result = sqlite3_step(fastFindRuleResultStmt);
      if (result == SQLITE_DONE)
        return false;
      if (result != SQLITE_ROW) {
        *error_out = getCurrentErrorMessage();
        return false;
      }

      // Otherwise, read the result contents from the row.
      assert(sqlite3_column_count(fastFindRuleResultStmt) == 8);
      dbKeyID = DBKeyID(sqlite3_column_int64(fastFindRuleResultStmt, 0));
      int numValueBytes = sqlite3_column_bytes(fastFindRuleResultStmt, 1);
      result_out->value.resize(numValueBytes);
      memcpy(result_out->value.data(),
             sqlite3_column_blob(fastFindRuleResultStmt, 1),
             numValueBytes);
      result_out->builtAt = sqlite3_column_int64(fastFindRuleResultStmt, 2);
      result_out->computedAt = sqlite3_column_int64(fastFindRuleResultStmt, 3);
      result_out->start = sqlite3_column_double(fastFindRuleResultStmt, 4);
      result_out->end = sqlite3_column_double(fastFindRuleResultStmt, 5);

      // Extract the dependencies binary blob.
      numDependencyBytes = sqlite3_column_bytes(fastFindRuleResultStmt, 6);
      dependencyBytes = sqlite3_column_blob(fastFindRuleResultStmt, 6);

      // Extract the signature
      result_out->signature =
        basic::CommandSignature(sqlite3_column_int64(fastFindRuleResultStmt, 7));
    } else {
      // KeyID is not known, perform the 'normal' search using the key value

      result = sqlite3_reset(findRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_clear_bindings(findRuleResultStmt);
      checkSQLiteResultOKReturnFalse(result);
      result = sqlite3_bind_text(findRuleResultStmt, /*index=*/1,
                                 key.data(), key.size(),
                                 SQLITE_STATIC);
      checkSQLiteResultOKReturnFalse(result);

      // If the rule wasn't found, we are done.
      result = sqlite3_step(findRuleResultStmt);
      if (result == SQLITE_DONE)
        return false;
      if (result != SQLITE_ROW) {
        *error_out = getCurrentErrorMessage();
        return false;
      }

      // Otherwise, read the result contents from the row.
      assert(sqlite3_column_count(findRuleResultStmt) == 8);
      dbKeyID = DBKeyID(sqlite3_column_int64(findRuleResultStmt, 0));
      int numValueBytes = sqlite3_column_bytes(findRuleResultStmt, 1);
      result_out->value.resize(numValueBytes);
      memcpy(result_out->value.data(),
             sqlite3_column_blob(findRuleResultStmt, 1),
             numValueBytes);
      result_out->builtAt = sqlite3_column_int64(findRuleResultStmt, 2);
      result_out->computedAt = sqlite3_column_int64(findRuleResultStmt, 3);
      result_out->start = sqlite3_column_double(findRuleResultStmt, 4);
      result_out->end = sqlite3_column_double(findRuleResultStmt, 5);

      // Cache the engine key mapping
      engineKeyIDs[dbKeyID] = keyID;
      dbKeyIDs[keyID] = dbKeyID;

      // Extract the dependencies binary blob.
      numDependencyBytes = sqlite3_column_bytes(findRuleResultStmt, 6);
      dependencyBytes = sqlite3_column_blob(findRuleResultStmt, 6);

      // Extract the signature
      result_out->signature =
        basic::CommandSignature(sqlite3_column_int64(findRuleResultStmt, 7));
    }


    int numDependencies = numDependencyBytes / sizeof(uint64_t);
    if (numDependencyBytes != static_cast<int>(numDependencies * sizeof(uint64_t))) {
      *error_out = (llvm::Twine("unexpected contents for database result: ") +
                    llvm::Twine((int)dbKeyID.value)).str();
      return false;
    }
    result_out->dependencies.resize(numDependencies);
    basic::BinaryDecoder decoder(
        StringRef((const char*)dependencyBytes, numDependencyBytes));
    for (auto i = 0; i != numDependencies; ++i) {
      uint64_t raw;
      decoder.read(raw);
      bool orderOnly = raw & 1;
      bool singleUse = (raw >> 1) & 1;
      DBKeyID dbKeyID(raw >> 2);

      // Map the database key ID into an engine key ID (note that we already
      // hold the dbMutex at this point as required by getKeyIDforID())
      KeyID keyID = getKeyIDForID(dbKeyID, error_out);
      if (!error_out->empty()) {
        return false;
      }
      result_out->dependencies.set(i, keyID, orderOnly, singleUse);
    }

    return true;
  }